

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilterBase_computeSigmaWeights_Test::TestBody
          (UnscentedKalmanFilterBase_computeSigmaWeights_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Scalar *pSVar3;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_5;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_4;
  size_t i;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_3;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_f8;
  Message local_f0 [3];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  T kappa;
  T beta;
  T alpha;
  UnscentedKalmanFilterBase_computeSigmaWeights_Test *this_local;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 1.0;
  ConcreteUKF<Kalman::Vector<float,_3>_>::ConcreteUKF
            ((ConcreteUKF<Kalman::Vector<float,_3>_> *)&gtest_ar.message_,1.0,2.0,1.0);
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_d8,"2","ukf.gamma",2.0,
             ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.beta);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(local_f0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)local_110,"1","ukf.lambda",1.0,
               ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.kappa);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                 ,0x27,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_118);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1> *)
                          ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.
                                  super_Matrix<float,_3,_1>.
                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                  m_storage + 4),0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)local_130,"0.25","ukf.sigmaWeights_m[0]",0.25,*pSVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar1) {
        testing::Message::Message(&local_138);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x29,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_138);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_138);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1> *)
                            ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                    sigmaWeights_m.super_Matrix<float,_7,_1>.
                                    super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                    m_storage.m_data + 0x14),0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)local_150,"2.25","ukf.sigmaWeights_c[0]",2.25,*pSVar3);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
        if (!bVar1) {
          testing::Message::Message(&local_158);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                     ,0x2a,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_158);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
          testing::Message::~Message(&local_158);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          for (gtest_ar_4.message_.ptr_ =
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
              gtest_ar_4.message_.ptr_ <
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
              gtest_ar_4.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(gtest_ar_4.message_.ptr_)->field_0x1) {
            pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1> *)
                                ((long)&ukf.
                                        super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                        sigmaWeights_m.super_Matrix<float,_7,_1>.
                                        super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                        m_storage.m_data + 0x14),(Index)gtest_ar_4.message_.ptr_);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)local_178,"0.125","ukf.sigmaWeights_c[i]",0.125,*pSVar3);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
            if (!bVar1) {
              testing::Message::Message(&local_180);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                         ,0x2e,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_180);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_180);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
            if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
              return;
            }
            pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>,_1> *)
                                ((long)&ukf.
                                        super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                        super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.
                                        super_Matrix<float,_3,_1>.
                                        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                        m_storage + 4),(Index)gtest_ar_4.message_.ptr_);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)local_198,"0.125","ukf.sigmaWeights_m[i]",0.125,*pSVar3);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
            if (!bVar1) {
              testing::Message::Message(&local_1a0);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
              testing::internal::AssertHelper::AssertHelper
                        (&local_1a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                         ,0x2f,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
              testing::internal::AssertHelper::~AssertHelper(&local_1a8);
              testing::Message::~Message(&local_1a0);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
            if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
              return;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, computeSigmaWeights) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    ukf.computeWeights();
    
    ASSERT_FLOAT_EQ(2, ukf.gamma);
    ASSERT_FLOAT_EQ(1, ukf.lambda);
    
    ASSERT_FLOAT_EQ(0.25, ukf.sigmaWeights_m[0]);
    ASSERT_FLOAT_EQ(2.25, ukf.sigmaWeights_c[0]);
    
    for(size_t i = 1; i < 7; i++)
    {
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_c[i]);
        ASSERT_FLOAT_EQ(0.125, ukf.sigmaWeights_m[i]);
    }
}